

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

uint __thiscall ON_3dPointListRef::SetFromMesh(ON_3dPointListRef *this,ON_Mesh *mesh)

{
  ON_3dPoint *pOVar1;
  ON_3fPoint *pOVar2;
  bool bVar3;
  uint uVar4;
  
  if ((mesh == (ON_Mesh *)0x0) || (uVar4 = ON_Mesh::VertexUnsignedCount(mesh), uVar4 == 0)) {
    this->m_point_count = 0;
    this->m_point_stride = 0;
    this->m_dP = (double *)0x0;
    this->m_fP = (float *)0x0;
  }
  else {
    bVar3 = ON_Mesh::HasDoublePrecisionVertices(mesh);
    if (bVar3) {
      pOVar1 = (mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
      this->m_fP = (float *)0x0;
      this->m_point_count = 0;
      this->m_point_stride = 0;
      this->m_dP = (double *)0x0;
      if (pOVar1 != (ON_3dPoint *)0x0 && uVar4 != 0xffffffff) {
        this->m_point_count = uVar4;
        this->m_point_stride = 3;
        this->m_dP = &pOVar1->x;
        return uVar4;
      }
    }
    else {
      pOVar2 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      this->m_fP = (float *)0x0;
      this->m_point_count = 0;
      this->m_point_stride = 0;
      this->m_dP = (double *)0x0;
      if (pOVar2 != (ON_3fPoint *)0x0 && uVar4 != 0xffffffff) {
        this->m_point_count = uVar4;
        this->m_point_stride = 3;
        this->m_fP = &pOVar2->x;
        return uVar4;
      }
    }
  }
  return 0;
}

Assistant:

unsigned int ON_3dPointListRef::SetFromMesh(
  const class ON_Mesh* mesh
  )
{
  if ( 0 != mesh )
  {
    const unsigned int vertex_count = mesh->VertexUnsignedCount();
    if ( vertex_count > 0 )
    {
      return (mesh->HasDoublePrecisionVertices())
      ? SetFromDoubleArray(vertex_count,3,(const double*)(mesh->m_dV.Array()))
      : SetFromFloatArray(vertex_count,3,(const float*)(mesh->m_V.Array()));
    }
  }
  *this = ON_3dPointListRef::EmptyPointList;
  return m_point_count;
}